

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_menu_begin(nk_context *ctx,nk_window *win,char *id,int is_clicked,nk_rect header,nk_vec2 size
                 )

{
  nk_window *pnVar1;
  nk_rect body_00;
  int iVar2;
  nk_hash nVar3;
  bool bVar4;
  bool bVar5;
  nk_hash hash;
  nk_window *popup;
  nk_rect body;
  int is_active;
  int is_open;
  int is_clicked_local;
  char *id_local;
  nk_window *win_local;
  nk_context *ctx_local;
  float fStack_20;
  nk_vec2 size_local;
  nk_rect header_local;
  
  size_local.x = header.x;
  size_local.y = header.y;
  header_local.y = header.h;
  iVar2 = nk_strlen(id);
  nVar3 = nk_murmur_hash(id,iVar2,0x40);
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x43d5,
                  "int nk_menu_begin(struct nk_context *, struct nk_window *, const char *, int, struct nk_rect, struct nk_vec2)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        header_local.w = 0.0;
      }
      else {
        ctx_local._4_4_ = size.x;
        fStack_20 = size.y;
        pnVar1 = (win->popup).win;
        bVar4 = pnVar1 != (nk_window *)0x0;
        bVar5 = false;
        if ((pnVar1 != (nk_window *)0x0) && (bVar5 = false, (win->popup).name == nVar3)) {
          bVar5 = (win->popup).type == NK_PANEL_MENU;
        }
        if (((((is_clicked != 0) && (bVar4)) && (!bVar5)) || ((bVar4 && (!bVar5)))) ||
           ((!bVar4 && ((!bVar5 && (is_clicked == 0)))))) {
          header_local.w = 0.0;
        }
        else {
          body_00.y = size_local.y + header_local.y;
          body_00.x = size_local.x;
          body_00.w = ctx_local._4_4_;
          body_00.h = fStack_20;
          iVar2 = nk_nonblock_begin(ctx,0x20,body_00,header,NK_PANEL_MENU);
          if (iVar2 == 0) {
            header_local.w = 0.0;
          }
          else {
            (win->popup).type = NK_PANEL_MENU;
            (win->popup).name = nVar3;
            header_local.w = 1.4013e-45;
          }
        }
      }
      return (int)header_local.w;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x43d7,
                  "int nk_menu_begin(struct nk_context *, struct nk_window *, const char *, int, struct nk_rect, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x43d6,
                "int nk_menu_begin(struct nk_context *, struct nk_window *, const char *, int, struct nk_rect, struct nk_vec2)"
               );
}

Assistant:

NK_INTERN int
nk_menu_begin(struct nk_context *ctx, struct nk_window *win,
    const char *id, int is_clicked, struct nk_rect header, struct nk_vec2 size)
{
    int is_open = 0;
    int is_active = 0;
    struct nk_rect body;
    struct nk_window *popup;
    nk_hash hash = nk_murmur_hash(id, (int)nk_strlen(id), NK_PANEL_MENU);

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    body.x = header.x;
    body.w = size.x;
    body.y = header.y + header.h;
    body.h = size.y;

    popup = win->popup.win;
    is_open = popup ? nk_true : nk_false;
    is_active = (popup && (win->popup.name == hash) && win->popup.type == NK_PANEL_MENU);
    if ((is_clicked && is_open && !is_active) || (is_open && !is_active) ||
        (!is_open && !is_active && !is_clicked)) return 0;
    if (!nk_nonblock_begin(ctx, NK_WINDOW_NO_SCROLLBAR, body, header, NK_PANEL_MENU))
        return 0;

    win->popup.type = NK_PANEL_MENU;
    win->popup.name = hash;
    return 1;
}